

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,anon_class_8_1_6971b95b fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *other;
  string_t *count_00;
  Vector *in_RDX;
  ValidityMask *result_validity;
  string_t *result_data;
  string_t *rdata;
  string_t *ldata;
  ValidityMask *in_stack_000000e8;
  idx_t in_stack_000000f0;
  string_t *in_stack_000000f8;
  string_t *in_stack_00000100;
  string_t *in_stack_00000108;
  anon_class_8_1_6971b95b in_stack_00000110;
  ValidityMask *in_stack_ffffffffffffff98;
  
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<duckdb::string_t>((Vector *)0xe32287);
  other = (TemplatedValidityMask<unsigned_long> *)
          FlatVector::GetData<duckdb::string_t>((Vector *)0xe32296);
  bVar1 = ConstantVector::IsNull((Vector *)0xe322a5);
  if (bVar1) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    count_00 = FlatVector::GetData<duckdb::string_t>((Vector *)0xe322e4);
    FlatVector::Validity((Vector *)0xe322f3);
    bVar1 = BinaryLambdaWrapper::AddsNulls();
    if (bVar1) {
      FlatVector::Validity((Vector *)0xe32317);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0xe3233f);
      FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff98);
    }
    ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,true>
              (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
               in_stack_000000e8,in_stack_00000110);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}